

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_convolve_y_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  uint16_t uVar1;
  int in_ECX;
  long in_RDX;
  int in_R8D;
  int in_R9D;
  int k;
  int32_t res;
  int x;
  int y;
  int16_t *y_filter;
  int fo_vert;
  int in_stack_ffffffffffffffbc;
  int val;
  int local_38;
  int local_34;
  
  av1_get_interp_filter_subpel_kernel(_k,x & 0xf);
  for (local_34 = 0; local_34 < in_R9D; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
      for (val = 0; val < (int)(uint)_k->taps; val = val + 1) {
      }
      uVar1 = clip_pixel_highbd(val,in_stack_ffffffffffffffbc);
      *(uint16_t *)(in_RDX + (long)(local_34 * in_ECX + local_38) * 2) = uVar1;
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_c(const uint16_t *src, int src_stride,
                                uint16_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_y,
                                const int subpel_y_qn, int bd) {
  const int fo_vert = filter_params_y->taps / 2 - 1;
  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, FILTER_BITS), bd);
    }
  }
}